

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O2

void __thiscall bloom_tests::bloom_match::test_method(bloom_match *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  Span<const_std::byte> sp;
  Span<const_std::byte> sp_00;
  Span<const_unsigned_char> vKey;
  const_string file;
  Span<const_unsigned_char> vKey_00;
  const_string file_00;
  Span<const_unsigned_char> vKey_01;
  const_string file_01;
  Span<const_unsigned_char> vKey_02;
  const_string file_02;
  Span<const_unsigned_char> vKey_03;
  const_string file_03;
  const_string file_04;
  Span<const_unsigned_char> vKey_04;
  const_string file_05;
  string_view hex;
  const_string file_06;
  string_view hex_00;
  check_type cVar4;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  DataStream spendStream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  DataStream stream;
  CBloomFilter filter;
  undefined1 local_2c0 [32];
  bool local_2a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  CTransaction spendingTx;
  uchar ch [260];
  CTransaction tx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(ch,
         _ZTAXtlN4util12hex_literals6detail3HexILm517EEEtlSt5arrayISt4byteLm258EEtlA258_S5_LS5_1ELS5_0ELS5_0ELS5_0ELS5_1ELS5_11ELS5_38ELS5_233ELS5_183ELS5_115ELS5_94ELS5_182ELS5_170ELS5_189ELS5_243ELS5_88ELS5_186ELS5_182ELS5_47ELS5_152ELS5_22ELS5_162ELS5_27ELS5_169ELS5_235ELS5_219ELS5_113ELS5_157ELS5_82ELS5_153ELS5_232ELS5_134ELS5_7ELS5_215ELS5_34ELS5_193ELS5_144ELS5_0ELS5_0ELS5_0ELS5_0ELS5_139ELS5_72ELS5_48ELS5_69ELS5_2ELS5_32ELS5_7ELS5_10ELS5_202ELS5_68ELS5_80ELS5_108ELS5_92ELS5_239ELS5_58ELS5_22ELS5_237ELS5_81ELS5_157ELS5_124ELS5_60ELS5_57ELS5_248ELS5_170ELS5_177ELS5_146ELS5_196ELS5_225ELS5_201ELS5_13ELS5_6ELS5_95ELS5_55ELS5_184ELS5_164ELS5_175ELS5_97ELS5_65ELS5_2ELS5_33ELS5_0ELS5_168ELS5_225ELS5_96ELS5_184ELS5_86ELS5_194ELS5_212ELS5_61ELS5_39ELS5_216ELS5_251ELS5_167ELS5_30ELS5_90ELS5_239ELS5_100ELS5_5ELS5_184ELS5_100ELS5_58ELS5_196ELS5_203ELS5_124ELS5_179ELS5_196ELS5_98ELS5_172ELS5_237ELS5_127ELS5_20ELS5_113ELS5_26ELS5_1ELS5_65ELS5_4ELS5_109ELS5_17ELS5_254ELS5_229ELS5_27ELS5_14ELS5_96ELS5_102ELS5_109ELS5_80ELS5_73ELS5_169ELS5_16ELS5_26ELS5_114ELS5_116ELS5_29ELS5_244ELS5_128ELS5_185ELS5_110ELS5_226ELS5_100ELS5_136ELS5_164ELS5_211ELS5_70ELS5_107ELS5_149ELS5_201ELS5_164ELS5_10ELS5_197ELS5_238ELS5_239ELS5_135ELS5_225ELS5_10ELS5_92ELS5_211ELS5_54ELS5_193ELS5_154ELS5_132ELS5_86ELS5_95ELS5_128ELS5_250ELS5_108ELS5_84ELS5_121ELS5_87ELS5_183ELS5_112ELS5_15ELS5_244ELS5_223ELS5_189ELS5_239ELS5_231ELS5_96ELS5_54ELS5_195ELS5_57ELS5_255ELS5_255ELS5_255ELS5_255ELS5_2ELS5_27ELS5_255ELS5_61ELS5_17ELS5_0ELS5_0ELS5_0ELS5_0ELS5_25ELS5_118ELS5_169ELS5_20ELS5_4ELS5_148ELS5_63ELS5_221ELS5_80ELS5_128ELS5_83ELS5_199ELS5_80ELS5_0ELS5_16ELS5_109ELS5_59ELS5_198ELS5_226ELS5_117ELS5_77ELS5_188ELS5_255ELS5_25ELS5_136ELS5_172ELS5_47ELS5_21ELS5_222ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_25ELS5_118ELS5_169ELS5_20ELS5_162ELS5_102ELS5_67ELS5_109ELS5_41ELS5_101ELS5_84ELS5_118ELS5_8ELS5_185ELS5_225ELS5_93ELS5_144ELS5_50ELS5_167ELS5_185ELS5_214ELS5_79ELS5_164ELS5_49ELS5_136ELS5_172EEEEE
         ,0x102);
  sp.m_size = 0x102;
  sp.m_data = ch;
  DataStream::DataStream(&stream,sp);
  CTransaction::CTransaction<DataStream>(&tx,&::TX_WITH_WITNESS,&stream);
  memcpy(ch,&DAT_00b66510,0x104);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vch,ch,ch + 0x103,
             (allocator_type *)&spendingTx);
  sp_00.m_size = (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_start;
  sp_00.m_data = vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  DataStream::DataStream(&spendStream,sp_00);
  CTransaction::CTransaction<DataStream>(&spendingTx,&::TX_WITH_WITNESS,&spendStream);
  CBloomFilter::CBloomFilter(&filter,10,1e-06,0,'\x01');
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xef65854fcd7fff6b;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4ff94f3dd6d56d40;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xc44dfd2720e88f31;
  vKey.m_size = 0x20;
  vKey.m_data = (uchar *)&data;
  CBloomFilter::insert(&filter,vKey);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x76;
  file.m_begin = (iterator)&local_378;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_388,msg);
  local_2c0[0] = CBloomFilter::IsRelevantAndUpdate(&filter,&tx);
  local_2c0._8_8_ = (element_type *)0x0;
  local_2c0._16_8_ = (sp_counted_base *)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "<W\x1b";
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_390 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2c0,(lazy_ostream *)&data,1,1,WARN,_cVar4,(size_t)&local_398,
             0x76);
  boost::detail::shared_count::~shared_count((shared_count *)(local_2c0 + 0x10));
  CBloomFilter::CBloomFilter((CBloomFilter *)&data,10,1e-06,0,'\x01');
  CBloomFilter::operator=(&filter,(CBloomFilter *)&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xc44dfd2720e88f31;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xef65854fcd7fff6b;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4ff94f3dd6d56d40;
  vKey_00.m_size = 0x20;
  vKey_00.m_data = (uchar *)&data;
  CBloomFilter::insert(&filter,vKey_00);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x7b;
  file_00.m_begin = (iterator)&local_3a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3b8,
             msg_00);
  local_2c0[0] = CBloomFilter::IsRelevantAndUpdate(&filter,&tx);
  local_2c0._8_8_ = (element_type *)0x0;
  local_2c0._16_8_ = (sp_counted_base *)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "<W\x1b";
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3c0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2c0,(lazy_ostream *)&data,1,1,WARN,_cVar4,(size_t)&local_3c8,
             0x7b);
  boost::detail::shared_count::~shared_count((shared_count *)(local_2c0 + 0x10));
  CBloomFilter::CBloomFilter((CBloomFilter *)&data,10,1e-06,0,'\x01');
  CBloomFilter::operator=(&filter,(CBloomFilter *)&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  memcpy(&data,util::hex_literals::detail::Hex<145ul>{std::array<std::byte_72ul>,0x48);
  vKey_01.m_size = 0x48;
  vKey_01.m_data = (uchar *)&data;
  CBloomFilter::insert(&filter,vKey_01);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x7f;
  file_01.m_begin = (iterator)&local_3d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3e8,
             msg_01);
  local_2c0[0] = CBloomFilter::IsRelevantAndUpdate(&filter,&tx);
  local_2c0._8_8_ = (element_type *)0x0;
  local_2c0._16_8_ = (sp_counted_base *)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "<W\x1b";
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3f0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2c0,(lazy_ostream *)&data,1,1,WARN,_cVar4,(size_t)&local_3f8,
             0x7f);
  boost::detail::shared_count::~shared_count((shared_count *)(local_2c0 + 0x10));
  CBloomFilter::CBloomFilter((CBloomFilter *)&data,10,1e-06,0,'\x01');
  CBloomFilter::operator=(&filter,(CBloomFilter *)&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  memcpy(&data,util::hex_literals::detail::Hex<131ul>{std::array<std::byte_65ul>,0x41);
  vKey_02.m_size = 0x41;
  vKey_02.m_data = (uchar *)&data;
  CBloomFilter::insert(&filter,vKey_02);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x83;
  file_02.m_begin = (iterator)&local_408;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_418,
             msg_02);
  local_2c0[0] = CBloomFilter::IsRelevantAndUpdate(&filter,&tx);
  local_2c0._8_8_ = (element_type *)0x0;
  local_2c0._16_8_ = (sp_counted_base *)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "<W\x1b";
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_420 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2c0,(lazy_ostream *)&data,1,1,WARN,_cVar4,(size_t)&local_428,
             0x83);
  boost::detail::shared_count::~shared_count((shared_count *)(local_2c0 + 0x10));
  CBloomFilter::CBloomFilter((CBloomFilter *)&data,10,1e-06,0,'\x01');
  CBloomFilter::operator=(&filter,(CBloomFilter *)&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc7538050dd3f9404;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x75e2c63b6d100050;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x19ffbc4d);
  vKey_03.m_size = 0x14;
  vKey_03.m_data = (uchar *)&data;
  CBloomFilter::insert(&filter,vKey_03);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  file_03.m_end = (iterator)0x87;
  file_03.m_begin = (iterator)&local_438;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_448,
             msg_03);
  local_2c0[0] = CBloomFilter::IsRelevantAndUpdate(&filter,&tx);
  local_2c0._8_8_ = (element_type *)0x0;
  local_2c0._16_8_ = (sp_counted_base *)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "<W\x1b";
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_450 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2c0,(lazy_ostream *)&data,1,1,WARN,_cVar4,(size_t)&local_458,
             0x87);
  boost::detail::shared_count::~shared_count((shared_count *)(local_2c0 + 0x10));
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  file_04.m_end = (iterator)0x88;
  file_04.m_begin = (iterator)&local_468;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_478,
             msg_04);
  local_2c0[0] = CBloomFilter::IsRelevantAndUpdate(&filter,&spendingTx);
  local_2c0._8_8_ = (element_type *)0x0;
  local_2c0._16_8_ = (sp_counted_base *)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "<W\x1b";
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_480 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2c0,(lazy_ostream *)&data,1,1,WARN,_cVar4,(size_t)&local_488,
             0x88);
  boost::detail::shared_count::~shared_count((shared_count *)(local_2c0 + 0x10));
  CBloomFilter::CBloomFilter((CBloomFilter *)&data,10,1e-06,0,'\x01');
  CBloomFilter::operator=(&filter,(CBloomFilter *)&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x765465296d4366a2;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xb9a732905de1b908;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x31a44fd6);
  vKey_04.m_size = 0x14;
  vKey_04.m_data = (uchar *)&data;
  CBloomFilter::insert(&filter,vKey_04);
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  file_05.m_end = (iterator)0x8c;
  file_05.m_begin = (iterator)&local_498;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_4a8,
             msg_05);
  local_2c0[0] = CBloomFilter::IsRelevantAndUpdate(&filter,&tx);
  local_2c0._8_8_ = (element_type *)0x0;
  local_2c0._16_8_ = (sp_counted_base *)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "<W\x1b";
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_4b0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2c0,(lazy_ostream *)&data,1,1,WARN,_cVar4,(size_t)&local_4b8,
             0x8c);
  boost::detail::shared_count::~shared_count((shared_count *)(local_2c0 + 0x10));
  CBloomFilter::CBloomFilter((CBloomFilter *)&data,10,1e-06,0,'\x01');
  CBloomFilter::operator=(&filter,(CBloomFilter *)&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  hex._M_str = "90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b";
  hex._M_len = 0x40;
  transaction_identifier<false>::FromHex((optional<transaction_identifier<false>_> *)local_2c0,hex);
  if (local_2a0 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT71(local_2c0._1_7_,local_2c0[0]);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_2c0._16_8_;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_2c0._8_8_;
    CBloomFilter::insert(&filter,(COutPoint *)&data);
    local_4c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_4c0 = "";
    local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar3;
    msg_06.m_begin = pvVar2;
    file_06.m_end = (iterator)0x90;
    file_06.m_begin = (iterator)&local_4c8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4d8,
               msg_06);
    local_2c0[0] = CBloomFilter::IsRelevantAndUpdate(&filter,&tx);
    local_2c0._8_8_ = (element_type *)0x0;
    local_2c0._16_8_ = (sp_counted_base *)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113b0d0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_4e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_4e0 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2c0,(lazy_ostream *)&data,1,1,WARN,_cVar4,
               (size_t)&local_4e8,0x90);
    boost::detail::shared_count::~shared_count((shared_count *)(local_2c0 + 0x10));
    CBloomFilter::CBloomFilter((CBloomFilter *)&data,10,1e-06,0,'\x01');
    CBloomFilter::operator=(&filter,(CBloomFilter *)&data);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    hex_00._M_str = "90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b";
    hex_00._M_len = 0x40;
    transaction_identifier<false>::FromHex((optional<transaction_identifier<false>_> *)&data,hex_00)
    ;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bloom_match)
{
    // Random real transaction (b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b)
    DataStream stream{
        "01000000010b26e9b7735eb6aabdf358bab62f9816a21ba9ebdb719d5299e88607d722c190000000008b4830450220070aca44506c5cef3a16ed519d7c3c39f8aab192c4e1c90d065f37b8a4af6141022100a8e160b856c2d43d27d8fba71e5aef6405b8643ac4cb7cb3c462aced7f14711a0141046d11fee51b0e60666d5049a9101a72741df480b96ee26488a4d3466b95c9a40ac5eeef87e10a5cd336c19a84565f80fa6c547957b7700ff4dfbdefe76036c339ffffffff021bff3d11000000001976a91404943fdd508053c75000106d3bc6e2754dbcff1988ac2f15de00000000001976a914a266436d2965547608b9e15d9032a7b9d64fa43188ac00000000"_hex,
    };
    CTransaction tx(deserialize, TX_WITH_WITNESS, stream);

    // and one which spends it (e2769b09e784f32f62ef849763d4f45b98e07ba658647343b915ff832b110436)
    unsigned char ch[] = {0x01, 0x00, 0x00, 0x00, 0x01, 0x6b, 0xff, 0x7f, 0xcd, 0x4f, 0x85, 0x65, 0xef, 0x40, 0x6d, 0xd5, 0xd6, 0x3d, 0x4f, 0xf9, 0x4f, 0x31, 0x8f, 0xe8, 0x20, 0x27, 0xfd, 0x4d, 0xc4, 0x51, 0xb0, 0x44, 0x74, 0x01, 0x9f, 0x74, 0xb4, 0x00, 0x00, 0x00, 0x00, 0x8c, 0x49, 0x30, 0x46, 0x02, 0x21, 0x00, 0xda, 0x0d, 0xc6, 0xae, 0xce, 0xfe, 0x1e, 0x06, 0xef, 0xdf, 0x05, 0x77, 0x37, 0x57, 0xde, 0xb1, 0x68, 0x82, 0x09, 0x30, 0xe3, 0xb0, 0xd0, 0x3f, 0x46, 0xf5, 0xfc, 0xf1, 0x50, 0xbf, 0x99, 0x0c, 0x02, 0x21, 0x00, 0xd2, 0x5b, 0x5c, 0x87, 0x04, 0x00, 0x76, 0xe4, 0xf2, 0x53, 0xf8, 0x26, 0x2e, 0x76, 0x3e, 0x2d, 0xd5, 0x1e, 0x7f, 0xf0, 0xbe, 0x15, 0x77, 0x27, 0xc4, 0xbc, 0x42, 0x80, 0x7f, 0x17, 0xbd, 0x39, 0x01, 0x41, 0x04, 0xe6, 0xc2, 0x6e, 0xf6, 0x7d, 0xc6, 0x10, 0xd2, 0xcd, 0x19, 0x24, 0x84, 0x78, 0x9a, 0x6c, 0xf9, 0xae, 0xa9, 0x93, 0x0b, 0x94, 0x4b, 0x7e, 0x2d, 0xb5, 0x34, 0x2b, 0x9d, 0x9e, 0x5b, 0x9f, 0xf7, 0x9a, 0xff, 0x9a, 0x2e, 0xe1, 0x97, 0x8d, 0xd7, 0xfd, 0x01, 0xdf, 0xc5, 0x22, 0xee, 0x02, 0x28, 0x3d, 0x3b, 0x06, 0xa9, 0xd0, 0x3a, 0xcf, 0x80, 0x96, 0x96, 0x8d, 0x7d, 0xbb, 0x0f, 0x91, 0x78, 0xff, 0xff, 0xff, 0xff, 0x02, 0x8b, 0xa7, 0x94, 0x0e, 0x00, 0x00, 0x00, 0x00, 0x19, 0x76, 0xa9, 0x14, 0xba, 0xde, 0xec, 0xfd, 0xef, 0x05, 0x07, 0x24, 0x7f, 0xc8, 0xf7, 0x42, 0x41, 0xd7, 0x3b, 0xc0, 0x39, 0x97, 0x2d, 0x7b, 0x88, 0xac, 0x40, 0x94, 0xa8, 0x02, 0x00, 0x00, 0x00, 0x00, 0x19, 0x76, 0xa9, 0x14, 0xc1, 0x09, 0x32, 0x48, 0x3f, 0xec, 0x93, 0xed, 0x51, 0xf5, 0xfe, 0x95, 0xe7, 0x25, 0x59, 0xf2, 0xcc, 0x70, 0x43, 0xf9, 0x88, 0xac, 0x00, 0x00, 0x00, 0x00, 0x00};
    std::vector<unsigned char> vch(ch, ch + sizeof(ch) -1);
    DataStream spendStream{vch};
    CTransaction spendingTx(deserialize, TX_WITH_WITNESS, spendStream);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(uint256{"b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b"});
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match tx hash");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    // byte-reversed tx hash
    filter.insert("6bff7fcd4f8565ef406dd5d63d4ff94f318fe82027fd4dc451b04474019f74b4"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match manually serialized tx hash");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("30450220070aca44506c5cef3a16ed519d7c3c39f8aab192c4e1c90d065f37b8a4af6141022100a8e160b856c2d43d27d8fba71e5aef6405b8643ac4cb7cb3c462aced7f14711a01"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match input signature");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("046d11fee51b0e60666d5049a9101a72741df480b96ee26488a4d3466b95c9a40ac5eeef87e10a5cd336c19a84565f80fa6c547957b7700ff4dfbdefe76036c339"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match input pub key");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("04943fdd508053c75000106d3bc6e2754dbcff19"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match output address");
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(spendingTx), "Simple Bloom filter didn't add output");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("a266436d2965547608b9e15d9032a7b9d64fa431"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match output address");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(COutPoint(Txid::FromHex("90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b").value(), 0));
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match COutPoint");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    COutPoint prevOutPoint(Txid::FromHex("90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b").value(), 0);
    {
        std::vector<unsigned char> data(32 + sizeof(unsigned int));
        memcpy(data.data(), prevOutPoint.hash.begin(), 32);
        memcpy(data.data()+32, &prevOutPoint.n, sizeof(unsigned int));
        filter.insert(data);
    }
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match manually serialized COutPoint");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(uint256{"00000009e784f32f62ef849763d4f45b98e07ba658647343b915ff832b110436"});
    BOOST_CHECK_MESSAGE(!filter.IsRelevantAndUpdate(tx), "Simple Bloom filter matched random tx hash");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("0000006d2965547608b9e15d9032a7b9d64fa431"_hex_u8);
    BOOST_CHECK_MESSAGE(!filter.IsRelevantAndUpdate(tx), "Simple Bloom filter matched random address");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(COutPoint(Txid::FromHex("90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b").value(), 1));
    BOOST_CHECK_MESSAGE(!filter.IsRelevantAndUpdate(tx), "Simple Bloom filter matched COutPoint for an output we didn't care about");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(COutPoint(Txid::FromHex("000000d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b").value(), 0));
    BOOST_CHECK_MESSAGE(!filter.IsRelevantAndUpdate(tx), "Simple Bloom filter matched COutPoint for an output we didn't care about");
}